

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O2

void __thiscall
Gudhi::persistence_matrix::
Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>
::~Matrix(Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>
          *this)

{
  Column_zp_settings *this_00;
  
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>
  ::reset(&this->matrix_,this->colSettings_);
  this_00 = this->colSettings_;
  if (this_00 != (Column_zp_settings *)0x0) {
    Column_zp_settings::~Column_zp_settings(this_00);
  }
  operator_delete(this_00,0x58);
  Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_rep_options_with_row_access<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_false,_false,_true,_false,_true>_>_>
  ::~Chain_matrix(&this->matrix_);
  return;
}

Assistant:

inline Matrix<PersistenceMatrixOptions>::~Matrix()
{
  matrix_.reset(colSettings_);
  delete colSettings_;
}